

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.c
# Opt level: O3

void layout_objmenu(gamewin *gw)

{
  char cVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  int iVar6;
  _func_void_gamewin_ptr *p_Var7;
  int iVar8;
  gamewin *__s;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  char weightstr [16];
  char local_48 [24];
  
  iVar3 = _COLS;
  iVar9 = _LINES;
  *(undefined4 *)((long)&gw[2].resize + 4) = 2;
  __s = gw[1].next;
  iVar6 = 2;
  if ((__s != (gamewin *)0x0) && (*(char *)&__s->draw != '\0')) {
    *(undefined4 *)((long)&gw[2].resize + 4) = 4;
    iVar6 = 4;
  }
  iVar10 = *(int *)&gw[1].prev;
  iVar4 = 0x34;
  if (iVar10 < 0x34) {
    iVar4 = iVar10;
  }
  iVar8 = iVar4 + iVar6;
  if (iVar9 <= iVar4 + iVar6) {
    iVar8 = iVar9;
  }
  *(int *)&gw[2].resize = iVar8;
  *(int *)&gw[2].win = iVar8 - iVar6;
  if (iVar10 < 1) {
    iVar9 = 0;
  }
  else {
    p_Var7 = gw[1].resize;
    lVar11 = 0;
    lVar12 = 0;
    iVar9 = 0;
    cVar2 = settings.invweight;
    do {
      sVar5 = strlen((char *)(p_Var7 + lVar11));
      iVar6 = *(int *)(p_Var7 + lVar11 + 0x104);
      iVar10 = (int)sVar5 + 2;
      if (iVar6 != 1) {
        iVar10 = (int)sVar5;
      }
      if (cVar2 == '\0') {
        cVar2 = '\0';
      }
      else if (*(int *)(p_Var7 + lVar11 + 0x118) != -1) {
        sprintf(local_48," {%d}");
        sVar5 = strlen(local_48);
        iVar10 = iVar10 + (int)sVar5;
        p_Var7 = gw[1].resize;
        iVar6 = *(int *)(p_Var7 + lVar11 + 0x104);
        cVar2 = settings.invweight;
      }
      if (iVar6 == 2) {
        cVar1 = (char)p_Var7[lVar11 + 0x121];
        iVar4 = iVar10 + 7;
LAB_0010e381:
        if (cVar1 == '\0') {
          iVar4 = iVar10;
        }
      }
      else {
        iVar4 = iVar10;
        if (iVar6 == 1) {
          cVar1 = (char)p_Var7[lVar11 + 0x120];
          iVar4 = iVar10 + 4;
          goto LAB_0010e381;
        }
      }
      if (iVar4 < iVar9) {
        iVar4 = iVar9;
      }
      iVar9 = iVar4;
      lVar12 = lVar12 + 1;
      lVar11 = lVar11 + 0x124;
    } while (lVar12 < *(int *)&gw[1].prev);
    __s = gw[1].next;
  }
  iVar6 = iVar3 + -4;
  if (iVar9 < iVar3 + -4) {
    iVar6 = iVar9;
  }
  *(int *)&gw[2].next = iVar6;
  *(int *)((long)&gw[2].win + 4) = iVar6 + 4;
  if ((__s != (gamewin *)0x0) && (sVar5 = strlen((char *)__s), (ulong)(long)(iVar6 + 4) < sVar5 + 4)
     ) {
    *(int *)&gw[2].next = (int)sVar5;
    *(int *)((long)&gw[2].win + 4) = (int)sVar5 + 4;
  }
  return;
}

Assistant:

static void layout_objmenu(struct gamewin *gw)
{
    struct win_objmenu *mdat = (struct win_objmenu*)gw->extra;
    char weightstr[16];
    int i, maxwidth, itemwidth;
    int scrheight = LINES;
    int scrwidth = COLS;
    
    /* calc height */
    mdat->frameheight = 2;
    if (mdat->title && mdat->title[0]) {
	mdat->frameheight += 2; /* window title + space */
    }
	
    mdat->height = mdat->frameheight + min(mdat->icount, 52);
    if (mdat->height > scrheight)
	mdat->height = scrheight;
    mdat->innerheight = mdat->height - mdat->frameheight;
    
    /* calc width */
    maxwidth = 0;
    for (i = 0; i < mdat->icount; i++) {
	itemwidth = strlen(mdat->items[i].caption);
	
	/* add extra space for an object symbol */
	if (mdat->items[i].role == MI_NORMAL)
	    itemwidth += 2;
	
	/* if the weight is known, leave space to show it */
	if (settings.invweight && mdat->items[i].weight != -1) {
	    sprintf(weightstr, " {%d}", mdat->items[i].weight);
	    itemwidth += strlen(weightstr);
	}
	if (mdat->items[i].role == MI_NORMAL && mdat->items[i].accel)
	    itemwidth += 4; /* "a - " */
	if (mdat->items[i].role == MI_HEADING && mdat->items[i].group_accel)
	    itemwidth += 7; /* "  (')')" */
	maxwidth = max(maxwidth, itemwidth);
    }
    
    mdat->innerwidth = maxwidth;
    if (mdat->innerwidth > scrwidth - 4)/* make sure there is space for window borders */
	mdat->innerwidth = scrwidth - 4;
    mdat->width = mdat->innerwidth + 4; /* border + space */
    
    if (mdat->title && mdat->width < strlen(mdat->title) + 4) {
	mdat->innerwidth = strlen(mdat->title);
	mdat->width = mdat->innerwidth + 4;
    }
}